

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.hpp
# Opt level: O0

void __thiscall Sinclair::ZXSpectrum::State::State(State *this)

{
  bool bVar1;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  State *local_10;
  State *this_local;
  
  local_10 = this;
  Reflection::StructImpl<Sinclair::ZXSpectrum::State>::StructImpl
            (&this->super_StructImpl<Sinclair::ZXSpectrum::State>);
  (this->super_StructImpl<Sinclair::ZXSpectrum::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00caaf68;
  CPU::Z80::State::State(&this->z80);
  ZXSpectrum::Video::State::State(&this->video);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->ram);
  this->last_7ffd = '\0';
  GI::AY38910::State::State(&this->ay);
  this->last_1ffd = '\0';
  bVar1 = Reflection::StructImpl<Sinclair::ZXSpectrum::State>::needs_declare
                    (&this->super_StructImpl<Sinclair::ZXSpectrum::State>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"z80",&local_41);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<CPU::Z80::State>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->z80,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"video",&local_69);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<Sinclair::ZXSpectrum::Video::State>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->video,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"ram",&local_91);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::
    declare<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->ram,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"last_7ffd",&local_b9);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<unsigned_char>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->last_7ffd,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"last_1ffd",&local_e1);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<unsigned_char>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->last_1ffd,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"ay",&local_109);
    Reflection::StructImpl<Sinclair::ZXSpectrum::State>::declare<GI::AY38910::State>
              (&this->super_StructImpl<Sinclair::ZXSpectrum::State>,&this->ay,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
  }
  return;
}

Assistant:

State() {
		if(needs_declare()) {
			DeclareField(z80);
			DeclareField(video);
			DeclareField(ram);
			DeclareField(last_7ffd);
			DeclareField(last_1ffd);
			DeclareField(ay);
		}
	}